

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

JSONNode * JSONNode::newJSONNode_Shallow(JSONNode *orig)

{
  JSONNode *pJVar1;
  size_t *psVar2;
  
  pJVar1 = (JSONNode *)operator_new(8);
  pJVar1->internal = orig->internal;
  orig->internal = (internalJSONNode *)0x0;
  psVar2 = getCtorCounter();
  *psVar2 = *psVar2 + 1;
  return pJVar1;
}

Assistant:

JSONNode * JSONNode::newJSONNode_Shallow(const JSONNode & orig) {
	#ifdef JSON_MEMORY_POOL
		return new((JSONNode*)json_node_mempool.allocate()) JSONNode(true, const_cast<JSONNode &>(orig));
	#elif defined(JSON_MEMORY_CALLBACKS)
		return new(json_malloc<JSONNode>(1)) JSONNode(true, const_cast<JSONNode &>(orig));
	#else
		return new JSONNode(true, const_cast<JSONNode &>(orig));
	#endif
}